

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeSizeof(ExpressionContext *ctx,SynSizeof *syntax)

{
  TypeBase *pTVar1;
  _func_int **pp_Var2;
  int iVar3;
  TypeBase *pTVar4;
  ExprBase *initializer;
  ExprBase *pEVar5;
  undefined4 extraout_var_00;
  char *msg;
  int iVar6;
  undefined4 extraout_var;
  
  pTVar4 = AnalyzeType(ctx,syntax->value,false,(bool *)0x0);
  if (pTVar4 == (TypeBase *)0x0) {
    initializer = AnalyzeExpression(ctx,syntax->value);
    pTVar4 = initializer->type;
    if (pTVar4 != ctx->typeAuto) {
      if (((pTVar4 != (TypeBase *)0x0) && (pTVar4->typeID == 0x18)) &&
         (*(char *)&pTVar4[3]._vptr_TypeBase == '\0')) {
        iVar3 = *(int *)&(pTVar4->name).end;
        iVar6 = (int)(pTVar4->name).begin;
LAB_00164a6e:
        anon_unknown.dwarf_94284::Stop
                  (ctx,&syntax->super_SynBase,"ERROR: type \'%.*s\' is not fully defined",
                   (ulong)(uint)(iVar3 - iVar6));
      }
      ResolveInitializerValue(ctx,&syntax->super_SynBase,initializer);
      if ((initializer->type != (TypeBase *)0x0) && (initializer->type->typeID - 0x1a < 3)) {
        __assert_fail("!isType<TypeArgumentSet>(value->type) && !isType<TypeMemberSet>(value->type) && !isType<TypeFunctionSet>(value->type)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x2e35,"ExprBase *AnalyzeSizeof(ExpressionContext &, SynSizeof *)");
      }
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pEVar5 = (ExprBase *)CONCAT44(extraout_var,iVar3);
      pTVar4 = initializer->type;
LAB_001649ea:
      pTVar1 = ctx->typeInt;
      pp_Var2 = (_func_int **)pTVar4->size;
      pEVar5->typeID = 6;
      pEVar5->source = &syntax->super_SynBase;
      pEVar5->type = pTVar1;
      pEVar5->next = (ExprBase *)0x0;
      pEVar5->listed = false;
      pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002234f0;
      pEVar5[1]._vptr_ExprBase = pp_Var2;
      return pEVar5;
    }
  }
  else {
    if (pTVar4->isGeneric == true) {
      msg = "ERROR: sizeof generic type is illegal";
      goto LAB_00164a31;
    }
    if (pTVar4 != ctx->typeAuto) {
      if (pTVar4->typeID == 0x18) {
        if (*(char *)&pTVar4[3]._vptr_TypeBase == '\0') {
          iVar3 = *(int *)&(pTVar4->name).end;
          iVar6 = (int)(pTVar4->name).begin;
          goto LAB_00164a6e;
        }
      }
      else if (pTVar4->typeID - 0x1a < 3) {
        __assert_fail("!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x2e23,"ExprBase *AnalyzeSizeof(ExpressionContext &, SynSizeof *)");
      }
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pEVar5 = (ExprBase *)CONCAT44(extraout_var_00,iVar3);
      goto LAB_001649ea;
    }
  }
  msg = "ERROR: sizeof auto type is illegal";
LAB_00164a31:
  anon_unknown.dwarf_94284::Stop(ctx,&syntax->super_SynBase,msg);
}

Assistant:

ExprBase* AnalyzeSizeof(ExpressionContext &ctx, SynSizeof *syntax)
{
	if(TypeBase *type = AnalyzeType(ctx, syntax->value, false))
	{
		if(type->isGeneric)
			Stop(ctx, syntax, "ERROR: sizeof generic type is illegal");

		if(type == ctx.typeAuto)
			Stop(ctx, syntax, "ERROR: sizeof auto type is illegal");

		if(TypeClass *typeClass = getType<TypeClass>(type))
		{
			if(!typeClass->completed)
				Stop(ctx, syntax, "ERROR: type '%.*s' is not fully defined", FMT_ISTR(type->name));
		}

		assert(!isType<TypeArgumentSet>(type) && !isType<TypeMemberSet>(type) && !isType<TypeFunctionSet>(type));

		return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, type->size);
	}

	ExprBase *value = AnalyzeExpression(ctx, syntax->value);

	if(value->type == ctx.typeAuto)
		Stop(ctx, syntax, "ERROR: sizeof auto type is illegal");

	if(TypeClass *typeClass = getType<TypeClass>(value->type))
	{
		if(!typeClass->completed)
			Stop(ctx, syntax, "ERROR: type '%.*s' is not fully defined", FMT_ISTR(value->type->name));
	}

	ResolveInitializerValue(ctx, syntax, value);

	assert(!isType<TypeArgumentSet>(value->type) && !isType<TypeMemberSet>(value->type) && !isType<TypeFunctionSet>(value->type));

	return new (ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(syntax, ctx.typeInt, value->type->size);
}